

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O3

void Saig_ManMarkCone_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  if (pObj != (Aig_Obj_t *)0x0) {
    do {
      if (pObj->TravId == p->nTravIds) {
        return;
      }
      pObj->TravId = p->nTravIds;
      Saig_ManMarkCone_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    } while (pObj != (Aig_Obj_t *)0x0);
  }
  return;
}

Assistant:

void Saig_ManMarkCone_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( pObj == NULL )
        return;
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    Saig_ManMarkCone_rec( p, Aig_ObjFanin0(pObj) );
    Saig_ManMarkCone_rec( p, Aig_ObjFanin1(pObj) );
}